

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

int __thiscall glu::Program::link(Program *this,char *__from,char *__to)

{
  bool bVar1;
  GLenum err;
  int iVar2;
  deUint64 dVar3;
  deUint64 dVar4;
  deUint32 program;
  string sStack_38;
  
  (this->m_info).linkOk = false;
  (this->m_info).linkTimeUs = 0;
  (this->m_info).infoLog._M_string_length = 0;
  *(this->m_info).infoLog._M_dataplus._M_p = '\0';
  dVar3 = deGetMicroseconds();
  (*this->m_gl->linkProgram)(this->m_program);
  dVar4 = deGetMicroseconds();
  (this->m_info).linkTimeUs = dVar4 - dVar3;
  err = (*this->m_gl->getError)();
  program = 0xef;
  checkError(err,"glLinkProgram()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0xef);
  bVar1 = getProgramLinkStatus(this->m_gl,this->m_program);
  (this->m_info).linkOk = bVar1;
  getProgramInfoLog_abi_cxx11_
            (&sStack_38,(glu *)this->m_gl,(Functions *)(ulong)this->m_program,program);
  std::__cxx11::string::operator=((string *)&this->m_info,(string *)&sStack_38);
  iVar2 = std::__cxx11::string::~string((string *)&sStack_38);
  return iVar2;
}

Assistant:

void Program::link (void)
{
	m_info.linkOk		= false;
	m_info.linkTimeUs	= 0;
	m_info.infoLog.clear();

	{
		deUint64 linkStart = deGetMicroseconds();
		m_gl.linkProgram(m_program);
		m_info.linkTimeUs = deGetMicroseconds() - linkStart;
	}
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glLinkProgram()");

	m_info.linkOk	= getProgramLinkStatus(m_gl, m_program);
	m_info.infoLog	= getProgramInfoLog(m_gl, m_program);
}